

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O2

CURLcode mqtt_setup_conn(Curl_easy *data,connectdata *conn)

{
  CURLcode CVar1;
  MQTT *pMVar2;
  
  pMVar2 = (MQTT *)(*Curl_ccalloc)(1,0x50);
  if (pMVar2 == (MQTT *)0x0) {
    CVar1 = CURLE_OUT_OF_MEMORY;
  }
  else {
    Curl_dyn_init(&pMVar2->recvbuf,0x10000);
    (data->req).p.mqtt = pMVar2;
    CVar1 = CURLE_OK;
  }
  return CVar1;
}

Assistant:

static CURLcode mqtt_setup_conn(struct Curl_easy *data,
                                struct connectdata *conn)
{
  /* allocate the HTTP-specific struct for the Curl_easy, only to survive
     during this request */
  struct MQTT *mq;
  (void)conn;
  DEBUGASSERT(data->req.p.mqtt == NULL);

  mq = calloc(1, sizeof(struct MQTT));
  if(!mq)
    return CURLE_OUT_OF_MEMORY;
  Curl_dyn_init(&mq->recvbuf, DYN_MQTT_RECV);
  data->req.p.mqtt = mq;
  return CURLE_OK;
}